

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int apiHandleError(sqlite3 *db,int rc)

{
  uint in_ESI;
  sqlite3 *in_RDI;
  uint local_4;
  
  if ((in_RDI->mallocFailed == '\0') && (in_ESI != 0xc0a)) {
    local_4 = in_ESI & in_RDI->errMask;
  }
  else {
    sqlite3OomClear(in_RDI);
    sqlite3Error(in_RDI,in_ESI);
    local_4 = 7;
  }
  return local_4;
}

Assistant:

static SQLITE_NOINLINE int apiHandleError(sqlite3 *db, int rc){
  if( db->mallocFailed || rc==SQLITE_IOERR_NOMEM ){
    sqlite3OomClear(db);
    sqlite3Error(db, SQLITE_NOMEM);
    return SQLITE_NOMEM_BKPT;
  }
  return rc & db->errMask;
}